

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::BayesianProbitRegressor::_InternalParse
          (BayesianProbitRegressor *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  int iVar2;
  Rep *pRVar3;
  bool bVar4;
  BayesianProbitRegressor_FeatureWeight *obj;
  MessageLite *msg;
  BayesianProbitRegressor_Gaussian *msg_00;
  string *psVar5;
  uint uVar6;
  char *field_name;
  undefined8 *puVar7;
  size_t size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *p;
  Arena *arena;
  ArenaStringPtr *pAVar8;
  internal *this_00;
  char cVar9;
  uint uVar10;
  pair<const_char_*,_unsigned_int> pVar11;
  StringPiece str;
  byte *local_80;
  InternalMetadata *local_78;
  ArenaStringPtr *local_70;
  ArenaStringPtr *local_68;
  ArenaStringPtr *local_60;
  ArenaStringPtr *local_58;
  ArenaStringPtr *local_50;
  ArenaStringPtr *local_48;
  ArenaStringPtr *local_40;
  ArenaStringPtr *local_38;
  
  local_80 = (byte *)ptr;
  bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_80,ctx->group_depth_);
  if (!bVar4) {
    local_78 = &(this->super_MessageLite)._internal_metadata_;
    local_38 = &this->sampledprobabilityoutputfeaturename_;
    local_40 = &this->pessimisticprobabilityoutputfeaturename_;
    local_48 = &this->varianceoutputfeaturename_;
    local_50 = &this->meanoutputfeaturename_;
    local_58 = &this->samplingtruncationinputfeaturename_;
    local_60 = &this->samplingscaleinputfeaturename_;
    local_68 = &this->optimisminputfeaturename_;
    local_70 = &this->regressioninputfeaturename_;
    do {
      bVar1 = *local_80;
      uVar10 = (uint)bVar1;
      p = local_80 + 1;
      if ((char)bVar1 < '\0') {
        uVar10 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar11 = google::protobuf::internal::ReadTagFallback((char *)local_80,uVar10);
          p = (byte *)pVar11.first;
          uVar10 = pVar11.second;
        }
        else {
          p = local_80 + 2;
        }
      }
      uVar6 = (uVar10 >> 3) - 1;
      local_80 = p;
      if (0x16 < uVar6) goto switchD_0031bea8_caseD_4;
      field_name = (char *)((long)&switchD_0031bea8::switchdataD_003bc3fc +
                           (long)(int)(&switchD_0031bea8::switchdataD_003bc3fc)[uVar6]);
      cVar9 = (char)uVar10;
      switch(uVar10 >> 3) {
      case 1:
        if (cVar9 != '\b') break;
        bVar1 = *p;
        uVar10 = (uint)bVar1;
        local_80 = p + 1;
        if ((char)bVar1 < '\0') {
          uVar10 = ((uint)bVar1 + (uint)*local_80 * 0x80) - 0x80;
          if ((char)*local_80 < '\0') {
            local_80 = p;
            pVar11 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar10);
            local_80 = (byte *)pVar11.first;
            this->numberoffeatures_ = pVar11.second;
            goto joined_r0x0031c175;
          }
          local_80 = p + 2;
        }
        this->numberoffeatures_ = uVar10;
        goto LAB_0031c1ca;
      case 2:
        if (cVar9 != '\x12') break;
        msg_00 = this->bias_;
        if (msg_00 == (BayesianProbitRegressor_Gaussian *)0x0) {
          arena = (Arena *)(local_78->ptr_ & 0xfffffffffffffffc);
          if ((local_78->ptr_ & 1U) != 0) {
            arena = *(Arena **)arena;
          }
          msg_00 = google::protobuf::Arena::
                   CreateMaybeMessage<CoreML::Specification::BayesianProbitRegressor_Gaussian>
                             (arena);
          this->bias_ = msg_00;
        }
        local_80 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                     (ctx,&msg_00->super_MessageLite,(char *)local_80);
        goto joined_r0x0031c175;
      case 3:
        if (cVar9 == '\x1a') {
          local_80 = p + -1;
          do {
            local_80 = local_80 + 1;
            pRVar3 = (this->features_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar3 == (Rep *)0x0) {
LAB_0031bfff:
              obj = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>
                              ((this->features_).super_RepeatedPtrFieldBase.arena_);
              msg = (MessageLite *)
                    google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                              (&(this->features_).super_RepeatedPtrFieldBase,obj);
            }
            else {
              iVar2 = (this->features_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar3->allocated_size <= iVar2) goto LAB_0031bfff;
              (this->features_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              msg = (MessageLite *)pRVar3->elements[iVar2];
            }
            local_80 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                         (ctx,msg,(char *)local_80);
            if (local_80 == (byte *)0x0) {
              return (char *)0x0;
            }
          } while ((local_80 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_80 == 0x1a));
          goto LAB_0031c1ca;
        }
        break;
      case 10:
        if (cVar9 == 'R') {
          puVar7 = (undefined8 *)(local_78->ptr_ & 0xfffffffffffffffc);
          pAVar8 = local_70;
          if ((local_78->ptr_ & 1U) != 0) {
            puVar7 = (undefined8 *)*puVar7;
          }
LAB_0031c12c:
          psVar5 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(pAVar8,puVar7);
          local_80 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                       (psVar5,(char *)local_80,ctx);
          this_00 = (internal *)(psVar5->_M_dataplus)._M_p;
          size = psVar5->_M_string_length;
          if ((long)size < 0) {
            google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      (size,"string length exceeds max size");
          }
LAB_0031c160:
          str.length_ = 0;
          str.ptr_ = (char *)size;
          bVar4 = google::protobuf::internal::VerifyUTF8(this_00,str,field_name);
          if (!bVar4) {
            return (char *)0x0;
          }
          goto joined_r0x0031c175;
        }
        break;
      case 0xb:
        if (cVar9 == 'Z') {
          puVar7 = (undefined8 *)(local_78->ptr_ & 0xfffffffffffffffc);
          if ((local_78->ptr_ & 1U) != 0) {
            puVar7 = (undefined8 *)*puVar7;
          }
          psVar5 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(local_68,puVar7);
          local_80 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                       (psVar5,(char *)local_80,ctx);
          this_00 = (internal *)(psVar5->_M_dataplus)._M_p;
          size = psVar5->_M_string_length;
          if ((long)size < 0) {
            google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      (size,"string length exceeds max size");
          }
          goto LAB_0031c160;
        }
        break;
      case 0xc:
        if (cVar9 == 'b') {
          puVar7 = (undefined8 *)(local_78->ptr_ & 0xfffffffffffffffc);
          pAVar8 = local_60;
          if ((local_78->ptr_ & 1U) != 0) {
            puVar7 = (undefined8 *)*puVar7;
          }
          goto LAB_0031c12c;
        }
        break;
      case 0xd:
        if (cVar9 == 'j') {
          puVar7 = (undefined8 *)(local_78->ptr_ & 0xfffffffffffffffc);
          pAVar8 = local_58;
          if ((local_78->ptr_ & 1U) != 0) {
            puVar7 = (undefined8 *)*puVar7;
          }
          goto LAB_0031c12c;
        }
        break;
      case 0x14:
        if (cVar9 == -0x5e) {
          puVar7 = (undefined8 *)(local_78->ptr_ & 0xfffffffffffffffc);
          pAVar8 = local_50;
          if ((local_78->ptr_ & 1U) != 0) {
            puVar7 = (undefined8 *)*puVar7;
          }
          goto LAB_0031c12c;
        }
        break;
      case 0x15:
        if (cVar9 == -0x56) {
          puVar7 = (undefined8 *)(local_78->ptr_ & 0xfffffffffffffffc);
          pAVar8 = local_48;
          if ((local_78->ptr_ & 1U) != 0) {
            puVar7 = (undefined8 *)*puVar7;
          }
          goto LAB_0031c12c;
        }
        break;
      case 0x16:
        if (cVar9 == -0x4e) {
          puVar7 = (undefined8 *)(local_78->ptr_ & 0xfffffffffffffffc);
          pAVar8 = local_40;
          if ((local_78->ptr_ & 1U) != 0) {
            puVar7 = (undefined8 *)*puVar7;
          }
          goto LAB_0031c12c;
        }
        break;
      case 0x17:
        if (cVar9 == -0x46) {
          puVar7 = (undefined8 *)(local_78->ptr_ & 0xfffffffffffffffc);
          pAVar8 = local_38;
          if ((local_78->ptr_ & 1U) != 0) {
            puVar7 = (undefined8 *)*puVar7;
          }
          goto LAB_0031c12c;
        }
      }
switchD_0031bea8_caseD_4:
      if ((uVar10 == 0) || ((uVar10 & 7) == 4)) {
        if (p == (byte *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar10 - 1;
        return (char *)p;
      }
      if ((local_78->ptr_ & 1U) == 0) {
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields_slow<std::__cxx11::string>(local_78);
      }
      else {
        unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((local_78->ptr_ & 0xfffffffffffffffcU) + 8);
      }
      local_80 = (byte *)google::protobuf::internal::UnknownFieldParse
                                   (uVar10,unknown,(char *)local_80,ctx);
joined_r0x0031c175:
      if (local_80 == (byte *)0x0) {
        return (char *)0x0;
      }
LAB_0031c1ca:
      bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_80,ctx->group_depth_);
    } while (!bVar4);
  }
  return (char *)local_80;
}

Assistant:

const char* BayesianProbitRegressor::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // uint32 numberOfFeatures = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          numberoffeatures_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.BayesianProbitRegressor.Gaussian bias = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_bias(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureWeight features = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_features(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else
          goto handle_unusual;
        continue;
      // string regressionInputFeatureName = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          auto str = _internal_mutable_regressioninputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string optimismInputFeatureName = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 90)) {
          auto str = _internal_mutable_optimisminputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string samplingScaleInputFeatureName = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 98)) {
          auto str = _internal_mutable_samplingscaleinputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string samplingTruncationInputFeatureName = 13;
      case 13:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 106)) {
          auto str = _internal_mutable_samplingtruncationinputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string meanOutputFeatureName = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          auto str = _internal_mutable_meanoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string varianceOutputFeatureName = 21;
      case 21:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 170)) {
          auto str = _internal_mutable_varianceoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string pessimisticProbabilityOutputFeatureName = 22;
      case 22:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 178)) {
          auto str = _internal_mutable_pessimisticprobabilityoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string sampledProbabilityOutputFeatureName = 23;
      case 23:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 186)) {
          auto str = _internal_mutable_sampledprobabilityoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}